

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifink(bifcxdef *ctx,int argc)

{
  int c;
  int extc;
  size_t sVar1;
  char str [20];
  char acStack_38 [32];
  
  outflushn(0);
  c = os_getc_raw();
  if (c == 0) {
    extc = os_getc_raw();
    c = 0;
  }
  else {
    extc = 0;
  }
  get_ext_key_name(acStack_38,c,extc);
  sVar1 = strlen(acStack_38);
  outreset();
  runpstr(ctx->bifcxrun,acStack_38,(int)sVar1,0);
  return;
}

Assistant:

void bifink(bifcxdef *ctx, int argc)
{
    int    c;
    int    extc;
    char   str[20];
    size_t len;
    
    bifcntargs(ctx, 0, argc);
    tioflushn(ctx->bifcxtio, 0);

    /* get a key */
    c = os_getc_raw();

    /* if it's extended, get the second part of the extended sequence */
    extc = (c == 0 ? os_getc_raw() : 0);

    /* map the extended key name */
    get_ext_key_name(str, c, extc);

    /* get the length of the name */
    len = strlen(str);

    /* reset the [more] counter */
    outreset();

    /* return the string, translating escapes */
    runpstr(ctx->bifcxrun, str, len, 0);
}